

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Replace>::copyAppend
          (QGenericArrayOps<Replace> *this,Replace *b,Replace *e)

{
  qsizetype *pqVar1;
  Replace *pRVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pRVar2 = (this->super_QArrayDataPointer<Replace>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<Replace>).size;
      pDVar4 = (b->in).d.d;
      pRVar2[lVar3].in.d.d = pDVar4;
      pRVar2[lVar3].in.d.ptr = (b->in).d.ptr;
      pRVar2[lVar3].in.d.size = (b->in).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar4 = (b->out).d.d;
      pRVar2[lVar3].out.d.d = pDVar4;
      pRVar2[lVar3].out.d.ptr = (b->out).d.ptr;
      pRVar2[lVar3].out.d.size = (b->out).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<Replace>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }